

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::FieldOptions::InternalSerializeWithCachedSizesToArray
          (FieldOptions *this,bool deterministic,uint8 *target)

{
  bool bVar1;
  FieldOptions_CType value;
  FieldOptions_JSType value_00;
  uint uVar2;
  UninterpretedOption *value_01;
  UnknownFieldSet *unknown_fields;
  uint local_48;
  uint n;
  uint i;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  FieldOptions *this_local;
  
  uVar2 = (this->_has_bits_).has_bits_[0];
  _i = target;
  if ((uVar2 & 1) != 0) {
    value = ctype(this);
    _i = internal::WireFormatLite::WriteEnumToArray(1,value,target);
  }
  if ((uVar2 & 2) != 0) {
    bVar1 = packed(this);
    _i = internal::WireFormatLite::WriteBoolToArray(2,bVar1,_i);
  }
  if ((uVar2 & 8) != 0) {
    bVar1 = deprecated(this);
    _i = internal::WireFormatLite::WriteBoolToArray(3,bVar1,_i);
  }
  if ((uVar2 & 4) != 0) {
    bVar1 = lazy(this);
    _i = internal::WireFormatLite::WriteBoolToArray(5,bVar1,_i);
  }
  if ((uVar2 & 0x20) != 0) {
    value_00 = jstype(this);
    _i = internal::WireFormatLite::WriteEnumToArray(6,value_00,_i);
  }
  if ((uVar2 & 0x10) != 0) {
    bVar1 = weak(this);
    _i = internal::WireFormatLite::WriteBoolToArray(10,bVar1,_i);
  }
  local_48 = 0;
  uVar2 = uninterpreted_option_size(this);
  for (; local_48 < uVar2; local_48 = local_48 + 1) {
    value_01 = uninterpreted_option(this,local_48);
    _i = internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<google::protobuf::UninterpretedOption>
                   (999,value_01,deterministic,_i);
  }
  _i = internal::ExtensionSet::InternalSerializeWithCachedSizesToArray
                 (&this->_extensions_,1000,0x20000000,deterministic,_i);
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = FieldOptions::unknown_fields(this);
    _i = internal::WireFormat::SerializeUnknownFieldsToArray(unknown_fields,_i);
  }
  return _i;
}

Assistant:

::google::protobuf::uint8* FieldOptions::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FieldOptions)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      1, this->ctype(), target);
  }

  // optional bool packed = 2;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(2, this->packed(), target);
  }

  // optional bool deprecated = 3 [default = false];
  if (cached_has_bits & 0x00000008u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(3, this->deprecated(), target);
  }

  // optional bool lazy = 5 [default = false];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(5, this->lazy(), target);
  }

  // optional .google.protobuf.FieldOptions.JSType jstype = 6 [default = JS_NORMAL];
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      6, this->jstype(), target);
  }

  // optional bool weak = 10 [default = false];
  if (cached_has_bits & 0x00000010u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(10, this->weak(), target);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned int i = 0, n = this->uninterpreted_option_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        999, this->uninterpreted_option(i), deterministic, target);
  }

  // Extension range [1000, 536870912)
  target = _extensions_.InternalSerializeWithCachedSizesToArray(
      1000, 536870912, deterministic, target);

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FieldOptions)
  return target;
}